

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ellswift_xdh
              (secp256k1_context *ctx,uchar *output,uchar *ell_a64,uchar *ell_b64,uchar *seckey32,
              int party,secp256k1_ellswift_xdh_hash_function hashfp,void *data)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  secp256k1_fe *in_R8;
  int in_R9D;
  uchar *theirs64;
  uchar sx [32];
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_fe px;
  secp256k1_fe xd;
  secp256k1_fe xn;
  secp256k1_scalar s;
  int overflow;
  int ret;
  char *in_stack_fffffffffffffea8;
  int *a;
  secp256k1_callback *in_stack_fffffffffffffeb0;
  int *overflow_00;
  uchar *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  secp256k1_scalar *in_stack_fffffffffffffec8;
  secp256k1_scalar *in_stack_fffffffffffffed0;
  secp256k1_fe local_128;
  secp256k1_fe local_100;
  secp256k1_fe local_d8 [3];
  secp256k1_fe *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar3;
  uint local_4;
  
  uVar3 = 0;
  if (in_RSI == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_4 = 0;
  }
  else if (in_RDX == (int *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_4 = 0;
  }
  else if (in_RCX == (int *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_4 = 0;
  }
  else if (in_R8 == (secp256k1_fe *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_4 = 0;
  }
  else if (theirs64 == (uchar *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_4 = 0;
  }
  else {
    a = in_RCX;
    if (in_R9D != 0) {
      a = in_RDX;
    }
    overflow_00 = a;
    secp256k1_fe_impl_set_b32_mod(&local_100,(uchar *)a);
    secp256k1_fe_impl_set_b32_mod(&local_128,(uchar *)(overflow_00 + 8));
    secp256k1_ellswift_xswiftec_frac_var
              (in_R8,(secp256k1_fe *)CONCAT44(in_R9D,uVar3),
               (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    secp256k1_scalar_set_b32
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8,overflow_00);
    iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x10d9ca);
    secp256k1_scalar_cmov
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
    secp256k1_ecmult_const_xonly
              ((secp256k1_fe *)t.n[1],(secp256k1_fe *)t.n[0],(secp256k1_fe *)sx._24_8_,
               (secp256k1_scalar *)sx._16_8_,sx._12_4_);
    secp256k1_fe_impl_normalize(local_d8);
    secp256k1_fe_impl_get_b32(&stack0xfffffffffffffeb8,local_d8);
    iVar2 = (*(code *)theirs64)(in_RSI,&stack0xfffffffffffffeb8,in_RDX,in_RCX,sx._0_8_);
    secp256k1_memclear(overflow_00,(size_t)a);
    secp256k1_fe_clear((secp256k1_fe *)0x10da88);
    secp256k1_scalar_clear((secp256k1_scalar *)0x10da95);
    local_4 = (uint)(iVar2 != 0 & (iVar1 != 0 ^ 0xffU) & 1);
  }
  return local_4;
}

Assistant:

int secp256k1_ellswift_xdh(const secp256k1_context *ctx, unsigned char *output, const unsigned char *ell_a64, const unsigned char *ell_b64, const unsigned char *seckey32, int party, secp256k1_ellswift_xdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow;
    secp256k1_scalar s;
    secp256k1_fe xn, xd, px, u, t;
    unsigned char sx[32];
    const unsigned char* theirs64;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(ell_a64 != NULL);
    ARG_CHECK(ell_b64 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(hashfp != NULL);

    /* Load remote public key (as fraction). */
    theirs64 = party ? ell_a64 : ell_b64;
    secp256k1_fe_set_b32_mod(&u, theirs64);
    secp256k1_fe_set_b32_mod(&t, theirs64 + 32);
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, &u, &t);

    /* Load private key (using one if invalid). */
    secp256k1_scalar_set_b32(&s, seckey32, &overflow);
    overflow = secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    /* Compute shared X coordinate. */
    secp256k1_ecmult_const_xonly(&px, &xn, &xd, &s, 1);
    secp256k1_fe_normalize(&px);
    secp256k1_fe_get_b32(sx, &px);

    /* Invoke hasher */
    ret = hashfp(output, sx, ell_a64, ell_b64, data);

    secp256k1_memclear(sx, sizeof(sx));
    secp256k1_fe_clear(&px);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}